

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O3

void __thiscall Entity::setAndLoadMesh(Entity *this,string *filePath)

{
  pointer pcVar1;
  Mesh *pMVar2;
  string local_40;
  
  pMVar2 = this->mesh;
  if (pMVar2 != (Mesh *)0x0) {
    Mesh::~Mesh(pMVar2);
    operator_delete(pMVar2);
  }
  pMVar2 = (Mesh *)operator_new(0x10);
  Mesh::Mesh(pMVar2);
  this->mesh = pMVar2;
  pcVar1 = (filePath->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + filePath->_M_string_length);
  Mesh::loadObj(pMVar2,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Entity::setAndLoadMesh(std::string filePath)
{
	if (mesh != NULL)
	{
		delete mesh;
	}

	mesh = new Mesh();
	mesh->loadObj(filePath);
}